

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

coda_conversion *
coda_conversion_new(double numerator,double denominator,double add_offset,double invalid_value)

{
  coda_conversion *conversion;
  double invalid_value_local;
  double add_offset_local;
  double denominator_local;
  double numerator_local;
  
  if ((denominator != 0.0) || (NAN(denominator))) {
    numerator_local = (double)malloc(0x28);
    if ((double *)numerator_local == (double *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x9c);
      numerator_local = 0.0;
    }
    else {
      *(double *)numerator_local = numerator;
      *(double *)((long)numerator_local + 8) = denominator;
      *(double *)((long)numerator_local + 0x10) = add_offset;
      *(double *)((long)numerator_local + 0x18) = invalid_value;
      *(double *)((long)numerator_local + 0x20) = 0.0;
    }
  }
  else {
    coda_set_error(-400,"denominator may not be 0 for conversion");
    numerator_local = 0.0;
  }
  return (coda_conversion *)numerator_local;
}

Assistant:

coda_conversion *coda_conversion_new(double numerator, double denominator, double add_offset, double invalid_value)
{
    coda_conversion *conversion;

    if (denominator == 0.0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "denominator may not be 0 for conversion");
        return NULL;
    }
    conversion = (coda_conversion *)malloc(sizeof(coda_conversion));
    if (conversion == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_conversion), __FILE__, __LINE__);
        return NULL;
    }
    conversion->numerator = numerator;
    conversion->denominator = denominator;
    conversion->add_offset = add_offset;
    conversion->invalid_value = invalid_value;
    conversion->unit = NULL;

    return conversion;
}